

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_link(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uv_buf_t uVar6;
  uv_fs_t req;
  undefined1 auStack_3a0 [88];
  long lStack_348;
  long lStack_340;
  code *pcStack_1e8;
  code *pcStack_1e0;
  undefined8 local_1d8;
  char local_1c8 [88];
  char *local_170;
  
  pcVar3 = "test_file";
  pcStack_1e0 = (code *)0x15e71b;
  unlink("test_file");
  pcStack_1e0 = (code *)0x15e727;
  unlink("test_file_link");
  pcStack_1e0 = (code *)0x15e733;
  unlink("test_file_link2");
  pcStack_1e0 = (code *)0x15e738;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar5 = (char *)0x0;
  pcStack_1e0 = (code *)0x15e75c;
  iVar1 = uv_fs_open(0,local_1c8,"test_file",0x42,0x180,0);
  pcVar4 = local_170;
  if (iVar1 < 0) {
    pcStack_1e0 = (code *)0x15ea9f;
    run_test_fs_link_cold_1();
LAB_0015ea9f:
    pcStack_1e0 = (code *)0x15eaa4;
    run_test_fs_link_cold_2();
LAB_0015eaa4:
    pcStack_1e0 = (code *)0x15eaa9;
    run_test_fs_link_cold_3();
LAB_0015eaa9:
    pcStack_1e0 = (code *)0x15eaae;
    run_test_fs_link_cold_4();
LAB_0015eaae:
    pcStack_1e0 = (code *)0x15eab3;
    run_test_fs_link_cold_5();
LAB_0015eab3:
    pcStack_1e0 = (code *)0x15eab8;
    run_test_fs_link_cold_6();
LAB_0015eab8:
    pcVar4 = pcVar3;
    pcStack_1e0 = (code *)0x15eabd;
    run_test_fs_link_cold_7();
LAB_0015eabd:
    pcStack_1e0 = (code *)0x15eac2;
    run_test_fs_link_cold_8();
LAB_0015eac2:
    pcStack_1e0 = (code *)0x15eac7;
    run_test_fs_link_cold_9();
LAB_0015eac7:
    pcStack_1e0 = (code *)0x15eacc;
    run_test_fs_link_cold_10();
LAB_0015eacc:
    pcStack_1e0 = (code *)0x15ead1;
    run_test_fs_link_cold_11();
LAB_0015ead1:
    pcStack_1e0 = (code *)0x15ead6;
    run_test_fs_link_cold_12();
LAB_0015ead6:
    pcStack_1e0 = (code *)0x15eadb;
    run_test_fs_link_cold_13();
LAB_0015eadb:
    pcVar3 = pcVar4;
    pcStack_1e0 = (code *)0x15eae0;
    run_test_fs_link_cold_14();
LAB_0015eae0:
    pcStack_1e0 = (code *)0x15eae5;
    run_test_fs_link_cold_15();
LAB_0015eae5:
    pcStack_1e0 = (code *)0x15eaea;
    run_test_fs_link_cold_16();
LAB_0015eaea:
    pcStack_1e0 = (code *)0x15eaef;
    run_test_fs_link_cold_17();
LAB_0015eaef:
    pcStack_1e0 = (code *)0x15eaf4;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar3 = local_170;
    if ((long)local_170 < 0) goto LAB_0015ea9f;
    pcStack_1e0 = (code *)0x15e77f;
    uv_fs_req_cleanup(local_1c8);
    pcStack_1e0 = (code *)0x15e790;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_1d8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e7c6;
    iVar1 = uv_fs_write(0,local_1c8,(ulong)pcVar4 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar3 = pcVar4;
    if (iVar1 != 0xd) goto LAB_0015eaa4;
    if (local_170 != (char *)0xd) goto LAB_0015eaa9;
    pcStack_1e0 = (code *)0x15e7e8;
    uv_fs_req_cleanup(local_1c8);
    pcStack_1e0 = (code *)0x15e7fb;
    uv_fs_close(loop,local_1c8,(ulong)pcVar4 & 0xffffffff,0);
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e816;
    iVar1 = uv_fs_link(0,local_1c8,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_0015eaae;
    if (local_170 != (char *)0x0) goto LAB_0015eab3;
    pcStack_1e0 = (code *)0x15e837;
    uv_fs_req_cleanup();
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e853;
    iVar1 = uv_fs_open(0,local_1c8,"test_file_link",2,0,0);
    pcVar4 = local_170;
    pcVar3 = local_1c8;
    if (iVar1 < 0) goto LAB_0015eab8;
    if ((long)local_170 < 0) goto LAB_0015eabd;
    pcStack_1e0 = (code *)0x15e876;
    uv_fs_req_cleanup(local_1c8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_1e0 = (code *)0x15e898;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_1d8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e8ca;
    iov = uVar6;
    iVar1 = uv_fs_read(0,local_1c8,(ulong)pcVar4 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_0015eac2;
    if ((long)local_170 < 0) goto LAB_0015eac7;
    pcVar5 = buf;
    pcStack_1e0 = (code *)0x15e8f1;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0015eacc;
    pcStack_1e0 = (code *)0x15e900;
    close((int)pcVar4);
    pcStack_1e0 = (code *)0x15e926;
    pcVar5 = (char *)loop;
    iVar1 = uv_fs_link(loop,local_1c8,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_0015ead1;
    pcStack_1e0 = (code *)0x15e93c;
    pcVar5 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_0015ead6;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e967;
    iVar1 = uv_fs_open(0,local_1c8,"test_file_link2",2,0,0);
    pcVar3 = local_170;
    if (iVar1 < 0) goto LAB_0015eadb;
    if ((long)local_170 < 0) goto LAB_0015eae0;
    pcStack_1e0 = (code *)0x15e98a;
    uv_fs_req_cleanup(local_1c8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_1e0 = (code *)0x15e9ac;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_1d8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e9de;
    iov = uVar6;
    iVar1 = uv_fs_read(0,local_1c8,(ulong)pcVar3 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_0015eae5;
    if ((long)local_170 < 0) goto LAB_0015eaea;
    pcVar5 = buf;
    pcStack_1e0 = (code *)0x15ea05;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0015eaef;
    pcStack_1e0 = (code *)0x15ea22;
    uv_fs_close(loop,local_1c8,(ulong)pcVar3 & 0xffffffff,0);
    pcStack_1e0 = (code *)0x15ea30;
    uv_run(loop,0);
    pcStack_1e0 = (code *)0x15ea3c;
    unlink("test_file");
    pcStack_1e0 = (code *)0x15ea48;
    unlink("test_file_link");
    pcStack_1e0 = (code *)0x15ea54;
    unlink("test_file_link2");
    pcStack_1e0 = (code *)0x15ea59;
    pcVar3 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x15ea6d;
    uv_walk(pcVar3,close_walk_cb,0);
    pcStack_1e0 = (code *)0x15ea77;
    uv_run(pcVar3,0);
    pcStack_1e0 = (code *)0x15ea7c;
    pcVar5 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x15ea84;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_1e0 = (code *)0x15ea8d;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStack_1e0 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar5)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar5)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_1e8 = (code *)0x15eb18;
    link_cb_cold_1();
  }
  pcStack_1e8 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_1e8 = (code *)pcVar3;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_3a0,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_0015ec1b;
    if (dummy_cb_count != 1) goto LAB_0015ec20;
    if (lStack_340 != 0) goto LAB_0015ec25;
    if (lStack_348 != -2) goto LAB_0015ec2a;
    uv_fs_req_cleanup(auStack_3a0);
    iVar1 = uv_fs_readlink(0,auStack_3a0,"no_such_file",0);
    if (iVar1 != -2) goto LAB_0015ec2f;
    if (lStack_340 != 0) goto LAB_0015ec34;
    if (lStack_348 == -2) {
      uv_fs_req_cleanup(auStack_3a0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0015ec3e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0015ec1b:
    run_test_fs_readlink_cold_2();
LAB_0015ec20:
    run_test_fs_readlink_cold_3();
LAB_0015ec25:
    run_test_fs_readlink_cold_4();
LAB_0015ec2a:
    run_test_fs_readlink_cold_5();
LAB_0015ec2f:
    run_test_fs_readlink_cold_6();
LAB_0015ec34:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015ec3e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_file link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  uv_fs_close(loop, &req, file, NULL);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  close(link);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(link_cb_count == 1);

  r = uv_fs_open(NULL, &req, "test_file_link2", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  uv_fs_close(loop, &req, link, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}